

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandInInventory::ParseNegatable(CommandInInventory *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  PClassActor *pPVar2;
  int local_20;
  int i;
  bool fullScreenOffsets_local;
  FScanner *sc_local;
  CommandInInventory *this_local;
  
  bVar1 = FScanner::CheckToken(sc,0x102);
  if (!bVar1) {
    FScanner::MustGetToken(sc,0x101);
  }
  local_20 = 0;
  do {
    if (1 < local_20) {
      return;
    }
    pPVar2 = PClass::FindActor(sc->String);
    this->item[local_20] = pPVar2;
    if ((this->item[local_20] == (PClassActor *)0x0) ||
       (bVar1 = PClass::IsAncestorOf
                          (AInventory::RegistrationInfo.MyClass,&this->item[local_20]->super_PClass)
       , !bVar1)) {
      FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
      this->item[local_20] = (PClassActor *)AInventory::RegistrationInfo.MyClass;
    }
    bVar1 = FScanner::CheckToken(sc,0x2c);
    if (bVar1) {
      FScanner::MustGetNumber(sc);
      this->amount[local_20] = sc->Number;
    }
    bVar1 = FScanner::CheckToken(sc,0x11c);
    if (bVar1) {
      this->conditionAnd = false;
      bVar1 = FScanner::CheckToken(sc,0x102);
      if (!bVar1) {
        FScanner::MustGetToken(sc,0x101);
      }
    }
    else {
      bVar1 = FScanner::CheckToken(sc,0x11b);
      if (!bVar1) {
        return;
      }
      this->conditionAnd = true;
      bVar1 = FScanner::CheckToken(sc,0x102);
      if (!bVar1) {
        FScanner::MustGetToken(sc,0x101);
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void	ParseNegatable(FScanner &sc, bool fullScreenOffsets)
		{
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			for(int i = 0;i < 2;i++)
			{
				item[i] = PClass::FindActor(sc.String);
				if(item[i] == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(item[i]))
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					item[i] = RUNTIME_CLASS(AInventory);
				}
		
				if (sc.CheckToken(','))
				{
					sc.MustGetNumber();
					amount[i] = sc.Number;
				}
		
				if(sc.CheckToken(TK_OrOr))
				{
					conditionAnd = false;
					if(!sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				}
				else if(sc.CheckToken(TK_AndAnd))
				{
					conditionAnd = true;
					if(!sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				}
				else
					break;
			}
		}